

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O3

void If_DsdManSave(If_DsdMan_t *p,char *pFileName)

{
  int iVar1;
  void *pvVar2;
  bool bVar3;
  FILE *__s;
  Vec_Mem_t *pVVar4;
  Vec_Ptr_t *pVVar5;
  size_t sVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  int Num;
  int local_34;
  
  if (pFileName == (char *)0x0) {
    __s = fopen(p->pStore,"wb");
    if (__s != (FILE *)0x0) goto LAB_00428a68;
    pFileName = p->pStore;
  }
  else {
    __s = fopen(pFileName,"wb");
    if (__s != (FILE *)0x0) {
LAB_00428a68:
      fwrite("dsd1",4,1,__s);
      fwrite(&local_34,4,1,__s);
      fwrite(&local_34,4,1,__s);
      local_34 = (p->vObjs).nSize;
      fwrite(&local_34,4,1,__s);
      if (2 < (p->vObjs).nSize) {
        lVar9 = 2;
        lVar8 = 8;
        do {
          pvVar2 = (p->vObjs).pArray[lVar9];
          local_34 = (*(uint *)((long)pvVar2 + 4) >> 0x1c) + 1 +
                     (uint)((*(uint *)((long)pvVar2 + 4) >> 0x1b & 1) != 0);
          fwrite(&local_34,4,1,__s);
          fwrite(pvVar2,(long)local_34 << 3,1,__s);
          if ((*(uint *)((long)pvVar2 + 4) & 7) == 6) {
            if ((p->vTruths).nSize <= lVar9) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                            ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
            }
            fwrite((void *)((long)(p->vTruths).pArray + lVar8),4,1,__s);
          }
          lVar9 = lVar9 + 1;
          lVar8 = lVar8 + 4;
        } while (lVar9 < (p->vObjs).nSize);
      }
      if (2 < p->nVars) {
        lVar8 = 3;
        do {
          iVar1 = p->vTtMem[lVar8]->nEntrySize;
          fwrite(&local_34,4,1,__s);
          pVVar4 = p->vTtMem[lVar8];
          if (0 < pVVar4->nEntries) {
            uVar7 = 0;
            do {
              if (pVVar4->ppPages[uVar7 >> ((byte)pVVar4->LogPageSze & 0x1f)] == (word *)0x0) break;
              fwrite(pVVar4->ppPages[uVar7 >> ((byte)pVVar4->LogPageSze & 0x1f)] +
                     (long)pVVar4->nEntrySize * (long)(int)(pVVar4->PageMask & uVar7),
                     (long)(iVar1 << 3),1,__s);
              uVar7 = uVar7 + 1;
              pVVar4 = p->vTtMem[lVar8];
            } while ((int)uVar7 < pVVar4->nEntries);
          }
          local_34 = p->vTtDecs[lVar8]->nSize;
          fwrite(&local_34,4,1,__s);
          pVVar5 = p->vTtDecs[lVar8];
          if (0 < pVVar5->nSize) {
            lVar9 = 0;
            do {
              pvVar2 = pVVar5->pArray[lVar9];
              local_34 = *(int *)((long)pvVar2 + 4);
              fwrite(&local_34,4,1,__s);
              fwrite(*(void **)((long)pvVar2 + 8),(long)local_34 << 2,1,__s);
              lVar9 = lVar9 + 1;
              pVVar5 = p->vTtDecs[lVar8];
            } while (lVar9 < pVVar5->nSize);
          }
          bVar3 = lVar8 < p->nVars;
          lVar8 = lVar8 + 1;
        } while (bVar3);
      }
      fwrite(&local_34,4,1,__s);
      fwrite(&local_34,4,1,__s);
      if (p->vConfigs == (Vec_Wrd_t *)0x0) {
        local_34 = 0;
      }
      else {
        local_34 = p->vConfigs->nSize;
      }
      fwrite(&local_34,4,1,__s);
      if ((long)local_34 != 0) {
        fwrite(p->vConfigs->pArray,(long)local_34 << 3,1,__s);
      }
      if (p->pCellStr == (char *)0x0) {
        local_34 = 0;
      }
      else {
        sVar6 = strlen(p->pCellStr);
        local_34 = (int)sVar6;
      }
      fwrite(&local_34,4,1,__s);
      if ((long)local_34 != 0) {
        fwrite(p->pCellStr,(long)local_34,1,__s);
      }
      fclose(__s);
      return;
    }
  }
  printf("Writing DSD manager file \"%s\" has failed.\n",pFileName);
  return;
}

Assistant:

void If_DsdManSave( If_DsdMan_t * p, char * pFileName )
{
    If_DsdObj_t * pObj; 
    Vec_Int_t * vSets;
    word * pTruth; 
    int i, v, Num;
    FILE * pFile = fopen( pFileName ? pFileName : p->pStore, "wb" );
    if ( pFile == NULL )
    {
        printf( "Writing DSD manager file \"%s\" has failed.\n", pFileName ? pFileName : p->pStore );
        return;
    }
    fwrite( DSD_VERSION, 4, 1, pFile );
    Num = p->nVars;
    fwrite( &Num, 4, 1, pFile );
    Num = p->LutSize;
    fwrite( &Num, 4, 1, pFile );
    Num = Vec_PtrSize(&p->vObjs);
    fwrite( &Num, 4, 1, pFile );
    Vec_PtrForEachEntryStart( If_DsdObj_t *, &p->vObjs, pObj, i, 2 )
    {
        Num = If_DsdObjWordNum( pObj->nFans );
        fwrite( &Num, 4, 1, pFile );
        fwrite( pObj, sizeof(word)*Num, 1, pFile );
        if ( pObj->Type == IF_DSD_PRIME )
            fwrite( Vec_IntEntryP(&p->vTruths, i), 4, 1, pFile );
    }
    for ( v = 3; v <= p->nVars; v++ )
    {
        int nBytes = sizeof(word)*Vec_MemEntrySize(p->vTtMem[v]);
        Num = Vec_MemEntryNum(p->vTtMem[v]);
        fwrite( &Num, 4, 1, pFile );
        Vec_MemForEachEntry( p->vTtMem[v], pTruth, i )
            fwrite( pTruth, nBytes, 1, pFile );
        Num = Vec_PtrSize(p->vTtDecs[v]);
        fwrite( &Num, 4, 1, pFile );
        Vec_PtrForEachEntry( Vec_Int_t *, p->vTtDecs[v], vSets, i )
        {
            Num = Vec_IntSize(vSets);
            fwrite( &Num, 4, 1, pFile );
            fwrite( Vec_IntArray(vSets), sizeof(int)*Num, 1, pFile );
        }
    }
    Num = p->nConfigWords;
    fwrite( &Num, 4, 1, pFile );
    Num = p->nTtBits;
    fwrite( &Num, 4, 1, pFile );
    Num = p->vConfigs ? Vec_WrdSize(p->vConfigs) : 0;
    fwrite( &Num, 4, 1, pFile );
    if ( Num )
        fwrite( Vec_WrdArray(p->vConfigs), sizeof(word)*Num, 1, pFile );
    Num = p->pCellStr ? strlen(p->pCellStr) : 0;
    fwrite( &Num, 4, 1, pFile );
    if ( Num )
        fwrite( p->pCellStr, sizeof(char)*Num, 1, pFile );
    fclose( pFile );
}